

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_handle_note_and_instrument(xm_context_t *ctx,xm_channel_context_t *ch,xm_pattern_slot_t *s)

{
  xm_instrument_t *pxVar1;
  sbyte sVar2;
  xm_context_t *ctx_00;
  byte *in_RDX;
  xm_channel_context_t *in_RSI;
  long in_RDI;
  float fVar3;
  xm_channel_context_t *in_stack_00000008;
  uint flags;
  uint32_t final_offset;
  uint z;
  xm_instrument_t *instr;
  undefined4 in_stack_ffffffffffffffa8;
  byte bVar4;
  undefined4 in_stack_ffffffffffffffac;
  xm_context_t *in_stack_ffffffffffffffb0;
  uint local_24;
  
  if (in_RDX[1] != 0) {
    if ((((in_RSI->current->effect_type == '\x03') || (in_RSI->current->effect_type == '\x05')) ||
        ((int)(uint)in_RSI->current->volume_column >> 4 == 0xf)) &&
       ((in_RSI->instrument != (xm_instrument_t *)0x0 && (in_RSI->sample != (xm_sample_t *)0x0)))) {
      xm_trigger_note(in_stack_ffffffffffffffb0,
                      (xm_channel_context_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    else if ((*in_RDX == 0) && (in_RSI->sample != (xm_sample_t *)0x0)) {
      xm_trigger_note(in_stack_ffffffffffffffb0,
                      (xm_channel_context_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
    }
    else if (*(ushort *)(in_RDI + 0x10) < (ushort)in_RDX[1]) {
      xm_cut_note(in_RSI);
      in_RSI->instrument = (xm_instrument_t *)0x0;
      in_RSI->sample = (xm_sample_t *)0x0;
    }
    else {
      in_RSI->instrument =
           (xm_instrument_t *)(*(long *)(in_RDI + 0x120) + (long)(int)(in_RDX[1] - 1) * 0xf8);
    }
  }
  if ((*in_RDX == 0) || (0x60 < *in_RDX)) {
    if (*in_RDX == 0x61) {
      xm_key_off((xm_channel_context_t *)0x109db8);
    }
  }
  else {
    pxVar1 = in_RSI->instrument;
    if ((((in_RSI->current->effect_type == '\x03') || (in_RSI->current->effect_type == '\x05')) ||
        ((int)(uint)in_RSI->current->volume_column >> 4 == 0xf)) &&
       ((pxVar1 != (xm_instrument_t *)0x0 && (in_RSI->sample != (xm_sample_t *)0x0)))) {
      in_RSI->note = ((float)(int)((uint)*in_RDX + (int)in_RSI->sample->relative_note) +
                     (float)(int)in_RSI->sample->finetune / 128.0) - 1.0;
      fVar3 = xm_period((xm_context_t *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0.0);
      in_RSI->tone_portamento_target_period = fVar3;
    }
    else if ((pxVar1 == (xm_instrument_t *)0x0) || (in_RSI->instrument->num_samples == 0)) {
      xm_cut_note(in_RSI);
    }
    else if ((ushort)pxVar1->sample_of_notes[(int)(*in_RDX - 1)] < pxVar1->num_samples) {
      for (local_24 = 0; local_24 < 0x20; local_24 = local_24 + 1) {
        fVar3 = xm_next_of_sample(in_stack_00000008);
        in_RSI->end_of_previous_sample[local_24] = fVar3;
      }
      in_RSI->frame_count = 0;
      in_RSI->sample = pxVar1->samples + (int)(uint)pxVar1->sample_of_notes[(int)(*in_RDX - 1)];
      fVar3 = ((float)(int)((uint)*in_RDX + (int)in_RSI->sample->relative_note) +
              (float)(int)in_RSI->sample->finetune / 128.0) - 1.0;
      in_RSI->note = fVar3;
      in_RSI->orig_note = fVar3;
      if (in_RDX[1] == 0) {
        xm_trigger_note(in_stack_ffffffffffffffb0,
                        (xm_channel_context_t *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      }
      else {
        xm_trigger_note(in_stack_ffffffffffffffb0,
                        (xm_channel_context_t *)
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      }
    }
    else {
      xm_cut_note(in_RSI);
    }
  }
  switch(in_RDX[2] >> 4) {
  case 5:
    if (0x50 < in_RDX[2]) break;
  case 1:
  case 2:
  case 3:
  case 4:
    in_RSI->volume = (float)(int)(in_RDX[2] - 0x10) / 64.0;
    break;
  default:
    break;
  case 8:
    xm_volume_slide(in_RSI,in_RDX[2] & 0xf);
    break;
  case 9:
    xm_volume_slide(in_RSI,in_RDX[2] << 4);
    break;
  case 10:
    in_RSI->vibrato_param = in_RSI->vibrato_param & 0xf | in_RDX[2] << 4;
    break;
  case 0xc:
    in_RSI->panning = (float)(byte)(in_RDX[2] << 4 | in_RDX[2] & 0xf) / 255.0;
    break;
  case 0xf:
    if ((in_RDX[2] & 0xf) != 0) {
      in_RSI->tone_portamento_param = in_RDX[2] << 4 | in_RDX[2] & 0xf;
    }
  }
  switch(in_RDX[3]) {
  case 1:
    if (in_RDX[4] != 0) {
      in_RSI->portamento_up_param = in_RDX[4];
    }
    break;
  case 2:
    if (in_RDX[4] != 0) {
      in_RSI->portamento_down_param = in_RDX[4];
    }
    break;
  case 3:
    if (in_RDX[4] != 0) {
      in_RSI->tone_portamento_param = in_RDX[4];
    }
    break;
  case 4:
    if ((in_RDX[4] & 0xf) != 0) {
      in_RSI->vibrato_param = in_RSI->vibrato_param & 0xf0 | in_RDX[4] & 0xf;
    }
    if ((int)(uint)in_RDX[4] >> 4 != 0) {
      in_RSI->vibrato_param = in_RDX[4] & 0xf0 | in_RSI->vibrato_param & 0xf;
    }
    break;
  case 5:
    if (in_RDX[4] != 0) {
      in_RSI->volume_slide_param = in_RDX[4];
    }
    break;
  case 6:
    if (in_RDX[4] != 0) {
      in_RSI->volume_slide_param = in_RDX[4];
    }
    break;
  case 7:
    if ((in_RDX[4] & 0xf) != 0) {
      in_RSI->tremolo_param = in_RSI->tremolo_param & 0xf0 | in_RDX[4] & 0xf;
    }
    if ((int)(uint)in_RDX[4] >> 4 != 0) {
      in_RSI->tremolo_param = in_RDX[4] & 0xf0 | in_RSI->tremolo_param & 0xf;
    }
    break;
  case 8:
    in_RSI->panning = (float)in_RDX[4] / 255.0;
    break;
  case 9:
    if (((in_RSI->sample != (xm_sample_t *)0x0) && (*in_RDX != 0)) && (*in_RDX < 0x61)) {
      sVar2 = 8;
      if (in_RSI->sample->bits == '\x10') {
        sVar2 = 7;
      }
      if ((uint)in_RDX[4] << sVar2 < in_RSI->sample->length) {
        in_RSI->sample_position = (float)((uint)in_RDX[4] << sVar2);
      }
      else {
        in_RSI->sample_position = -1.0;
      }
    }
    break;
  case 10:
    if (in_RDX[4] != 0) {
      in_RSI->volume_slide_param = in_RDX[4];
    }
    break;
  case 0xb:
    if ((ushort)in_RDX[4] < *(ushort *)(in_RDI + 8)) {
      *(undefined1 *)(in_RDI + 0x150) = 1;
      *(byte *)(in_RDI + 0x152) = in_RDX[4];
      *(undefined1 *)(in_RDI + 0x153) = 0;
    }
    break;
  case 0xc:
    if (in_RDX[4] < 0x41) {
      bVar4 = in_RDX[4];
    }
    else {
      bVar4 = 0x40;
    }
    in_RSI->volume = (float)bVar4 / 64.0;
    break;
  case 0xd:
    *(undefined1 *)(in_RDI + 0x151) = 1;
    *(byte *)(in_RDI + 0x153) = (char)((int)(uint)in_RDX[4] >> 4) * '\n' + (in_RDX[4] & 0xf);
    break;
  case 0xe:
    ctx_00 = (xm_context_t *)(ulong)((in_RDX[4] >> 4) - 1);
    switch(ctx_00) {
    case (xm_context_t *)0x0:
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->fine_portamento_up_param = in_RDX[4] & 0xf;
      }
      xm_pitch_slide(ctx_00,(xm_channel_context_t *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0.0);
      break;
    case (xm_context_t *)0x1:
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->fine_portamento_down_param = in_RDX[4] & 0xf;
      }
      xm_pitch_slide(ctx_00,(xm_channel_context_t *)
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0.0);
      break;
    default:
      break;
    case (xm_context_t *)0x3:
      in_RSI->vibrato_waveform = in_RDX[4] & XM_RANDOM_WAVEFORM;
      in_RSI->vibrato_waveform_retrigger =
           (_Bool)((((int)(uint)in_RDX[4] >> 2 & 1U) != 0 ^ 0xffU) & 1);
      break;
    case (xm_context_t *)0x4:
      if (((in_RSI->current->note != '\0') && (in_RSI->current->note < 0x61)) &&
         (in_RSI->sample != (xm_sample_t *)0x0)) {
        in_RSI->note = ((float)(int)((uint)in_RSI->current->note +
                                    (int)in_RSI->sample->relative_note) +
                       (float)(int)(((in_RDX[4] & 0xf) - 8) * 0x10) / 128.0) - 1.0;
        fVar3 = xm_period((xm_context_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0.0);
        in_RSI->period = fVar3;
        xm_update_frequency(ctx_00,(xm_channel_context_t *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      }
      break;
    case (xm_context_t *)0x5:
      if ((in_RDX[4] & 0xf) == 0) {
        in_RSI->pattern_loop_origin = *(uint8_t *)(in_RDI + 0x13d);
        *(uint8_t *)(in_RDI + 0x153) = in_RSI->pattern_loop_origin;
      }
      else if ((in_RDX[4] & 0xf) == in_RSI->pattern_loop_count) {
        in_RSI->pattern_loop_count = '\0';
      }
      else {
        in_RSI->pattern_loop_count = in_RSI->pattern_loop_count + '\x01';
        *(undefined1 *)(in_RDI + 0x150) = 1;
        *(uint8_t *)(in_RDI + 0x153) = in_RSI->pattern_loop_origin;
        *(undefined1 *)(in_RDI + 0x152) = *(undefined1 *)(in_RDI + 0x13c);
      }
      break;
    case (xm_context_t *)0x6:
      in_RSI->tremolo_waveform = in_RDX[4] & XM_RANDOM_WAVEFORM;
      in_RSI->tremolo_waveform_retrigger =
           (_Bool)((((int)(uint)in_RDX[4] >> 2 & 1U) != 0 ^ 0xffU) & 1);
      break;
    case (xm_context_t *)0x9:
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->fine_volume_slide_param = in_RDX[4] & 0xf;
      }
      xm_volume_slide(in_RSI,in_RSI->fine_volume_slide_param << 4);
      break;
    case (xm_context_t *)0xa:
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->fine_volume_slide_param = in_RDX[4] & 0xf;
      }
      xm_volume_slide(in_RSI,in_RSI->fine_volume_slide_param);
      break;
    case (xm_context_t *)0xc:
      if ((*in_RDX == 0) && (in_RDX[1] == 0)) {
        if ((in_RSI->current->effect_param & 0xf) == 0) {
          xm_trigger_note(ctx_00,(xm_channel_context_t *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        }
        else {
          in_RSI->note = in_RSI->orig_note;
          xm_trigger_note(ctx_00,(xm_channel_context_t *)
                                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
        }
      }
      break;
    case (xm_context_t *)0xd:
      *(ushort *)(in_RDI + 0x154) = (in_RSI->current->effect_param & 0xf) * *(short *)(in_RDI + 300)
      ;
    }
    break;
  case 0xf:
    if (in_RDX[4] != 0) {
      if (in_RDX[4] < 0x20) {
        *(ushort *)(in_RDI + 300) = (ushort)in_RDX[4];
      }
      else {
        *(ushort *)(in_RDI + 0x12e) = (ushort)in_RDX[4];
      }
    }
    break;
  case 0x10:
    if (in_RDX[4] < 0x41) {
      bVar4 = in_RDX[4];
    }
    else {
      bVar4 = 0x40;
    }
    *(float *)(in_RDI + 0x130) = (float)bVar4 / 64.0;
    break;
  case 0x11:
    if (in_RDX[4] != 0) {
      in_RSI->global_volume_slide_param = in_RDX[4];
    }
    break;
  default:
    break;
  case 0x15:
    in_RSI->volume_envelope_frame_count = (ushort)in_RDX[4];
    in_RSI->panning_envelope_frame_count = (ushort)in_RDX[4];
    break;
  case 0x19:
    if (in_RDX[4] != 0) {
      in_RSI->panning_slide_param = in_RDX[4];
    }
    break;
  case 0x1b:
    if (in_RDX[4] != 0) {
      if ((int)(uint)in_RDX[4] >> 4 == 0) {
        in_RSI->multi_retrig_param = in_RSI->multi_retrig_param & 0xf0 | in_RDX[4] & 0xf;
      }
      else {
        in_RSI->multi_retrig_param = in_RDX[4];
      }
    }
    break;
  case 0x1d:
    if (in_RDX[4] != 0) {
      in_RSI->tremor_param = in_RDX[4];
    }
    break;
  case 0x21:
    if (in_RDX[4] >> 4 == 1) {
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->extra_fine_portamento_up_param = in_RDX[4] & 0xf;
      }
      xm_pitch_slide(in_stack_ffffffffffffffb0,
                     (xm_channel_context_t *)CONCAT44(in_stack_ffffffffffffffac,1),0.0);
    }
    else if (in_RDX[4] >> 4 == 2) {
      if ((in_RDX[4] & 0xf) != 0) {
        in_RSI->extra_fine_portamento_down_param = in_RDX[4] & 0xf;
      }
      xm_pitch_slide(in_stack_ffffffffffffffb0,
                     (xm_channel_context_t *)CONCAT44(in_stack_ffffffffffffffac,2),0.0);
    }
  }
  return;
}

Assistant:

static void xm_handle_note_and_instrument(xm_context_t* ctx, xm_channel_context_t* ch,
										  xm_pattern_slot_t* s) {
	if(s->instrument > 0) {
		if(HAS_TONE_PORTAMENTO(ch->current) && ch->instrument != NULL && ch->sample != NULL) {
			/* Tone portamento in effect, unclear stuff happens */
			xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_PERIOD | XM_TRIGGER_KEEP_SAMPLE_POSITION);
		} else if(s->note == 0 && ch->sample != NULL) {
			/* Ghost instrument, trigger note */
			/* Sample position is kept, but envelopes are reset */
			xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_SAMPLE_POSITION);
		} else if(s->instrument > ctx->module.num_instruments) {
			/* Invalid instrument, Cut current note */
			xm_cut_note(ch);
			ch->instrument = NULL;
			ch->sample = NULL;
		} else {
			ch->instrument = ctx->module.instruments + (s->instrument - 1);
		}
	}

	if(NOTE_IS_VALID(s->note)) {
		/* Yes, the real note number is s->note -1. Try finding
		 * THAT in any of the specs! :-) */

		xm_instrument_t* instr = ch->instrument;

		if(HAS_TONE_PORTAMENTO(ch->current) && instr != NULL && ch->sample != NULL) {
			/* Tone portamento in effect */
			ch->note = s->note + ch->sample->relative_note + ch->sample->finetune / 128.f - 1.f;
			ch->tone_portamento_target_period = xm_period(ctx, ch->note);
		} else if(instr == NULL || ch->instrument->num_samples == 0) {
			/* Bad instrument */
			xm_cut_note(ch);
		} else {
			if(instr->sample_of_notes[s->note - 1] < instr->num_samples) {
#if XM_RAMPING
				for(unsigned int z = 0; z < XM_SAMPLE_RAMPING_POINTS; ++z) {
					ch->end_of_previous_sample[z] = xm_next_of_sample(ch);
				}
				ch->frame_count = 0;
#endif
				ch->sample = instr->samples + instr->sample_of_notes[s->note - 1];
				ch->orig_note = ch->note = s->note + ch->sample->relative_note
					+ ch->sample->finetune / 128.f - 1.f;
				if(s->instrument > 0) {
					xm_trigger_note(ctx, ch, 0);
				} else {
					/* Ghost note: keep old volume */
					xm_trigger_note(ctx, ch, XM_TRIGGER_KEEP_VOLUME);
				}
			} else {
				/* Bad sample */
				xm_cut_note(ch);
			}
		}
	} else if(s->note == 97) {
		/* Key Off */
		xm_key_off(ch);
	}

	switch(s->volume_column >> 4) {

	case 0x5:
		if(s->volume_column > 0x50) break;
	case 0x1:
	case 0x2:
	case 0x3:
	case 0x4:
		/* Set volume */
		ch->volume = (float)(s->volume_column - 0x10) / (float)0x40;
		break;

	case 0x8: /* Fine volume slide down */
		xm_volume_slide(ch, s->volume_column & 0x0F);
		break;

	case 0x9: /* Fine volume slide up */
		xm_volume_slide(ch, s->volume_column << 4);
		break;

	case 0xA: /* Set vibrato speed */
		ch->vibrato_param = (ch->vibrato_param & 0x0F) | ((s->volume_column & 0x0F) << 4);
		break;

	case 0xC: /* Set panning */
		ch->panning = (float)(
			((s->volume_column & 0x0F) << 4) | (s->volume_column & 0x0F)
			) / (float)0xFF;
		break;

	case 0xF: /* Tone portamento */
		if(s->volume_column & 0x0F) {
			ch->tone_portamento_param = ((s->volume_column & 0x0F) << 4)
				| (s->volume_column & 0x0F);
		}
		break;

	default:
		break;

	}

	switch(s->effect_type) {

	case 1: /* 1xx: Portamento up */
		if(s->effect_param > 0) {
			ch->portamento_up_param = s->effect_param;
		}
		break;

	case 2: /* 2xx: Portamento down */
		if(s->effect_param > 0) {
			ch->portamento_down_param = s->effect_param;
		}
		break;

	case 3: /* 3xx: Tone portamento */
		if(s->effect_param > 0) {
			ch->tone_portamento_param = s->effect_param;
		}
		break;

	case 4: /* 4xy: Vibrato */
		if(s->effect_param & 0x0F) {
			/* Set vibrato depth */
			ch->vibrato_param = (ch->vibrato_param & 0xF0) | (s->effect_param & 0x0F);
		}
		if(s->effect_param >> 4) {
			/* Set vibrato speed */
			ch->vibrato_param = (s->effect_param & 0xF0) | (ch->vibrato_param & 0x0F);
		}
		break;

	case 5: /* 5xy: Tone portamento + Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 6: /* 6xy: Vibrato + Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 7: /* 7xy: Tremolo */
		if(s->effect_param & 0x0F) {
			/* Set tremolo depth */
			ch->tremolo_param = (ch->tremolo_param & 0xF0) | (s->effect_param & 0x0F);
		}
		if(s->effect_param >> 4) {
			/* Set tremolo speed */
			ch->tremolo_param = (s->effect_param & 0xF0) | (ch->tremolo_param & 0x0F);
		}
		break;

	case 8: /* 8xx: Set panning */
		ch->panning = (float)s->effect_param / (float)0xFF;
		break;

	case 9: /* 9xx: Sample offset */
		if(ch->sample != NULL && NOTE_IS_VALID(s->note)) {
			uint32_t final_offset = s->effect_param << (ch->sample->bits == 16 ? 7 : 8);
			if(final_offset >= ch->sample->length) {
				/* Pretend the sample dosen't loop and is done playing */
				ch->sample_position = -1;
				break;
			}
			ch->sample_position = final_offset;
		}
		break;

	case 0xA: /* Axy: Volume slide */
		if(s->effect_param > 0) {
			ch->volume_slide_param = s->effect_param;
		}
		break;

	case 0xB: /* Bxx: Position jump */
		if(s->effect_param < ctx->module.length) {
			ctx->position_jump = true;
			ctx->jump_dest = s->effect_param;
			ctx->jump_row = 0;
		}
		break;

	case 0xC: /* Cxx: Set volume */
		ch->volume = (float)((s->effect_param > 0x40)
							 ? 0x40 : s->effect_param) / (float)0x40;
		break;

	case 0xD: /* Dxx: Pattern break */
		/* Jump after playing this line */
		ctx->pattern_break = true;
		ctx->jump_row = (s->effect_param >> 4) * 10 + (s->effect_param & 0x0F);
		break;

	case 0xE: /* EXy: Extended command */
		switch(s->effect_param >> 4) {

		case 1: /* E1y: Fine portamento up */
			if(s->effect_param & 0x0F) {
				ch->fine_portamento_up_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, -ch->fine_portamento_up_param);
			break;

		case 2: /* E2y: Fine portamento down */
			if(s->effect_param & 0x0F) {
				ch->fine_portamento_down_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, ch->fine_portamento_down_param);
			break;

		case 4: /* E4y: Set vibrato control */
			ch->vibrato_waveform = s->effect_param & 3;
			ch->vibrato_waveform_retrigger = !((s->effect_param >> 2) & 1);
			break;

		case 5: /* E5y: Set finetune */
			if(NOTE_IS_VALID(ch->current->note) && ch->sample != NULL) {
				ch->note = ch->current->note + ch->sample->relative_note +
					(float)(((s->effect_param & 0x0F) - 8) << 4) / 128.f - 1.f;
				ch->period = xm_period(ctx, ch->note);
				xm_update_frequency(ctx, ch);
			}
			break;

		case 6: /* E6y: Pattern loop */
			if(s->effect_param & 0x0F) {
				if((s->effect_param & 0x0F) == ch->pattern_loop_count) {
					/* Loop is over */
					ch->pattern_loop_count = 0;
					break;
				}

				/* Jump to the beginning of the loop */
				ch->pattern_loop_count++;
				ctx->position_jump = true;
				ctx->jump_row = ch->pattern_loop_origin;
				ctx->jump_dest = ctx->current_table_index;
			} else {
				/* Set loop start point */
				ch->pattern_loop_origin = ctx->current_row;
				/* Replicate FT2 E60 bug */
				ctx->jump_row = ch->pattern_loop_origin;
			}
			break;

		case 7: /* E7y: Set tremolo control */
			ch->tremolo_waveform = s->effect_param & 3;
			ch->tremolo_waveform_retrigger = !((s->effect_param >> 2) & 1);
			break;

		case 0xA: /* EAy: Fine volume slide up */
			if(s->effect_param & 0x0F) {
				ch->fine_volume_slide_param = s->effect_param & 0x0F;
			}
			xm_volume_slide(ch, ch->fine_volume_slide_param << 4);
			break;

		case 0xB: /* EBy: Fine volume slide down */
			if(s->effect_param & 0x0F) {
				ch->fine_volume_slide_param = s->effect_param & 0x0F;
			}
			xm_volume_slide(ch, ch->fine_volume_slide_param);
			break;

		case 0xD: /* EDy: Note delay */
			/* XXX: figure this out better. EDx triggers
			 * the note even when there no note and no
			 * instrument. But ED0 acts like like a ghost
			 * note, EDx (x ≠ 0) does not. */
			if(s->note == 0 && s->instrument == 0) {
				unsigned int flags = XM_TRIGGER_KEEP_VOLUME;

				if(ch->current->effect_param & 0x0F) {
					ch->note = ch->orig_note;
					xm_trigger_note(ctx, ch, flags);
				} else {
					xm_trigger_note(
						ctx, ch,
						flags
						| XM_TRIGGER_KEEP_PERIOD
						| XM_TRIGGER_KEEP_SAMPLE_POSITION
						);
				}
			}
			break;

		case 0xE: /* EEy: Pattern delay */
			ctx->extra_ticks = (ch->current->effect_param & 0x0F) * ctx->tempo;
			break;

		default:
			break;

		}
		break;

	case 0xF: /* Fxx: Set tempo/BPM */
		if(s->effect_param > 0) {
			if(s->effect_param <= 0x1F) {
				ctx->tempo = s->effect_param;
			} else {
				ctx->bpm = s->effect_param;
			}
		}
		break;

	case 16: /* Gxx: Set global volume */
		ctx->global_volume = (float)((s->effect_param > 0x40)
									 ? 0x40 : s->effect_param) / (float)0x40;
		break;

	case 17: /* Hxy: Global volume slide */
		if(s->effect_param > 0) {
			ch->global_volume_slide_param = s->effect_param;
		}
		break;

	case 21: /* Lxx: Set envelope position */
		ch->volume_envelope_frame_count = s->effect_param;
		ch->panning_envelope_frame_count = s->effect_param;
		break;

	case 25: /* Pxy: Panning slide */
		if(s->effect_param > 0) {
			ch->panning_slide_param = s->effect_param;
		}
		break;

	case 27: /* Rxy: Multi retrig note */
		if(s->effect_param > 0) {
			if((s->effect_param >> 4) == 0) {
				/* Keep previous x value */
				ch->multi_retrig_param = (ch->multi_retrig_param & 0xF0) | (s->effect_param & 0x0F);
			} else {
				ch->multi_retrig_param = s->effect_param;
			}
		}
		break;

	case 29: /* Txy: Tremor */
		if(s->effect_param > 0) {
			/* Tremor x and y params do not appear to be separately
			 * kept in memory, unlike Rxy */
			ch->tremor_param = s->effect_param;
		}
		break;

	case 33: /* Xxy: Extra stuff */
		switch(s->effect_param >> 4) {

		case 1: /* X1y: Extra fine portamento up */
			if(s->effect_param & 0x0F) {
				ch->extra_fine_portamento_up_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, -1.0f * ch->extra_fine_portamento_up_param);
			break;

		case 2: /* X2y: Extra fine portamento down */
			if(s->effect_param & 0x0F) {
				ch->extra_fine_portamento_down_param = s->effect_param & 0x0F;
			}
			xm_pitch_slide(ctx, ch, ch->extra_fine_portamento_down_param);
			break;

		default:
			break;

		}
		break;

	default:
		break;

	}
}